

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoalesceLocals.cpp
# Opt level: O1

void __thiscall wasm::CoalesceLocals::calculateInterferences(CoalesceLocals *this)

{
  ulong *puVar1;
  uint uVar2;
  pointer puVar3;
  Function *this_00;
  BasicBlock *pBVar4;
  long lVar5;
  BasicBlock *pBVar6;
  uint *puVar7;
  Expression *expr;
  uint32_t i_00;
  pointer puVar8;
  void *pvVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  Index IVar13;
  size_type sVar14;
  pointer pLVar15;
  size_t sVar16;
  Type type;
  Type *pTVar17;
  Type *pTVar18;
  size_t sVar19;
  ulong uVar20;
  uint j_00;
  Index i;
  pointer puVar21;
  uint *puVar22;
  ulong uVar23;
  long lVar24;
  iterator __begin3;
  Index j;
  uint uVar25;
  long lVar26;
  Literals local_198;
  undefined1 local_160 [8];
  ValueNumbering valueNumbering;
  undefined1 local_b8 [8];
  vector<bool,_std::allocator<bool>_> endsLiveRange;
  vector<unsigned_int,_std::allocator<unsigned_int>_> values;
  undefined1 local_68 [8];
  SetOfLocals live;
  Iterator __begin3_1;
  
  sparse_square_matrix<bool>::recreate
            (&this->interferences,
             (this->
             super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
             ).
             super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>.
             numLocals);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &endsLiveRange.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage,
             (ulong)(this->
                    super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                    ).
                    super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                    .numLocals,(allocator_type *)local_160);
  local_160._0_4_ = 0;
  valueNumbering._0_8_ = &valueNumbering.literalValues._M_h._M_rehash_policy._M_next_resize;
  valueNumbering.literalValues._M_h._M_buckets = (__buckets_ptr)0x1;
  valueNumbering.literalValues._M_h._M_bucket_count = 0;
  valueNumbering.literalValues._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  valueNumbering.literalValues._M_h._M_element_count._0_4_ = 0x3f800000;
  valueNumbering.literalValues._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  valueNumbering.literalValues._M_h._M_rehash_policy._4_4_ = 0;
  valueNumbering.literalValues._M_h._M_rehash_policy._M_next_resize = 0;
  valueNumbering.literalValues._M_h._M_single_bucket =
       (__node_base_ptr)&valueNumbering.expressionValues._M_h._M_rehash_policy._M_next_resize;
  valueNumbering.expressionValues._M_h._M_buckets = (__buckets_ptr)0x1;
  valueNumbering.expressionValues._M_h._M_bucket_count = 0;
  valueNumbering.expressionValues._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  valueNumbering.expressionValues._M_h._M_element_count._0_4_ = 0x3f800000;
  valueNumbering.expressionValues._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  valueNumbering.expressionValues._M_h._M_rehash_policy._4_4_ = 0;
  valueNumbering.expressionValues._M_h._M_rehash_policy._M_next_resize = 0;
  puVar21 = (this->
            super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
            ).super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
            .
            super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
            .basicBlocks.
            super__Vector_base<std::unique_ptr<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = *(pointer *)
            ((long)&(this->
                    super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                    ).
                    super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                    .
                    super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
                    .basicBlocks.
                    super__Vector_base<std::unique_ptr<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
                    ._M_impl.super__Vector_impl_data + 8);
  if (puVar21 != puVar3) {
    this_00 = (this->
              super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
              ).
              super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
              .
              super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
              .
              super_ControlFlowWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
              .super_PostWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>.
              super_Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>.
              currFunction;
    do {
      local_b8 = (undefined1  [8])
                 (puVar21->_M_t).
                 super___uniq_ptr_impl<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>
                 .
                 super__Head_base<0UL,_wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_false>
                 ._M_head_impl;
      sVar14 = std::
               _Hashtable<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>,_std::hash<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::count(&(this->
                        super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                        ).
                        super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                        .liveBlocks._M_h,(key_type *)local_b8);
      if (sVar14 != 0) {
        pBVar4 = (puVar21->_M_t).
                 super___uniq_ptr_impl<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>
                 .
                 super__Head_base<0UL,_wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_false>
                 ._M_head_impl;
        local_68[0] = 0;
        std::vector<bool,_std::allocator<bool>_>::vector
                  ((vector<bool,_std::allocator<bool>_> *)local_b8,
                   ((long)*(pointer *)((long)&(pBVar4->contents).actions + 8) -
                    *(long *)&(pBVar4->contents).actions.
                              super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>
                              ._M_impl >> 3) * -0x5555555555555555,(bool *)local_68,
                   (allocator_type *)
                   &live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,
                   &(((puVar21->_M_t).
                      super___uniq_ptr_impl<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>
                      .
                      super__Head_base<0UL,_wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_false>
                     ._M_head_impl)->contents).end.
                    super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
        uVar25 = (int)((long)*(pointer *)((long)&(pBVar4->contents).actions + 8) -
                       *(long *)&(pBVar4->contents).actions.
                                 super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>
                                 ._M_impl >> 3) * -0x55555555;
        if (0 < (int)uVar25) {
          uVar23 = (ulong)(uVar25 & 0x7fffffff);
          lVar26 = uVar23 + 1;
          lVar24 = uVar23 * 0x18 + -8;
          do {
            lVar5 = *(long *)&(pBVar4->contents).actions.
                              super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>
                              ._M_impl;
            IVar13 = *(Index *)(lVar5 + -0xc + lVar24);
            if (*(int *)(lVar5 + -0x10 + lVar24) == 0) {
              bVar10 = SortedVector::has((SortedVector *)local_68,IVar13);
              if (!bVar10) {
                puVar1 = (ulong *)((long)&(((Liveness *)local_b8)->start).
                                          super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start +
                                  (lVar26 - 2U >> 6) * 8);
                *puVar1 = *puVar1 | 1L << ((byte)(lVar26 - 2U) & 0x3f);
                SortedVector::insert((SortedVector *)local_68,IVar13);
              }
            }
            else {
              bVar10 = SortedVector::erase((SortedVector *)local_68,IVar13);
              if (bVar10) {
                *(undefined1 *)(lVar5 + lVar24) = 1;
              }
            }
            lVar26 = lVar26 + -1;
            lVar24 = lVar24 + -0x18;
          } while (1 < lVar26);
        }
        pBVar6 = (puVar21->_M_t).
                 super___uniq_ptr_impl<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>
                 .
                 super__Head_base<0UL,_wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_false>
                 ._M_head_impl;
        puVar8 = (pointer)CONCAT71(local_68._1_7_,local_68[0]);
        puVar22 = *(uint **)&(pBVar6->contents).start;
        puVar7 = *(pointer *)((long)&(pBVar6->contents).start + 8);
        if (((long)live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start - (long)puVar8 != (long)puVar7 - (long)puVar22)
           || ((live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != puVar8 &&
               (iVar12 = bcmp(puVar8,puVar22,
                              (long)live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start - (long)puVar8),
               iVar12 != 0)))) {
          __assert_fail("live == curr->contents.start",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/CoalesceLocals.cpp"
                        ,0xc2,"void wasm::CoalesceLocals::calculateInterferences()");
        }
        if (pBVar6 == (this->
                      super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                      ).
                      super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                      .
                      super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
                      .entry) {
          for (uVar23 = 0; sVar19 = Function::getNumParams(this_00), uVar23 < sVar19;
              uVar23 = (ulong)((int)uVar23 + 1)) {
            *(undefined4 *)
             ((long)endsLiveRange.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage + uVar23 * 4) = local_160._0_4_;
            local_160._0_4_ = local_160._0_4_ + 1;
          }
          sVar19 = Function::getNumParams(this_00);
          while( true ) {
            sVar16 = Function::getNumLocals(this_00);
            uVar23 = sVar19 & 0xffffffff;
            if (sVar16 <= uVar23) break;
            type = Function::getLocalType(this_00,(Index)sVar19);
            __begin3_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
                 (size_t)type;
            bVar10 = wasm::Type::isNonNullable
                               ((Type *)&__begin3_1.
                                         super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                         .index);
            if (bVar10) {
LAB_00681a83:
              *(undefined4 *)
               ((long)endsLiveRange.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_end_of_storage + uVar23 * 4) = local_160._0_4_;
              local_160._0_4_ = local_160._0_4_ + 1;
            }
            else {
              bVar10 = wasm::Type::isTuple((Type *)&__begin3_1.
                                                                                                        
                                                  super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                                  .index);
              if (bVar10) {
                live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     (pointer)&__begin3_1.
                               super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               index;
                __begin3_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                parent = (Type *)0x0;
                pTVar17 = (Type *)wasm::Type::size((Type *)live.
                                                  super_vector<unsigned_int,_std::allocator<unsigned_int>_>
                                                  .
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                bVar10 = (size_t *)
                         live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage ==
                         &__begin3_1.
                          super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                         && __begin3_1.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            parent == pTVar17;
                while (!bVar10) {
                  pTVar18 = wasm::Type::Iterator::operator*
                                      ((Iterator *)
                                       &live.
                                        super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  valueNumbering.expressionValues._M_h._M_single_bucket =
                       (__node_base_ptr)pTVar18->id;
                  bVar11 = wasm::Type::isNonNullable
                                     ((Type *)&valueNumbering.expressionValues._M_h._M_single_bucket
                                     );
                  if (bVar11) {
                    if (!bVar10) goto LAB_00681a83;
                    break;
                  }
                  __begin3_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                  parent = (Type *)((long)&(__begin3_1.
                                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                           .parent)->id + 1);
                  bVar10 = (size_t *)
                           live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage ==
                           &__begin3_1.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            index && __begin3_1.
                                     super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                     .parent == pTVar17;
                }
              }
              Literal::makeZeros(&local_198,type);
              IVar13 = ValueNumbering::getValue((ValueNumbering *)local_160,&local_198);
              *(Index *)((long)endsLiveRange.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_end_of_storage + uVar23 * 4) = IVar13;
              std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                        (&local_198.super_SmallVector<wasm::Literal,_1UL>.flexible);
              Literal::~Literal(local_198.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems);
            }
            sVar19 = (size_t)((Index)sVar19 + 1);
          }
        }
        else {
          for (; puVar22 != puVar7; puVar22 = puVar22 + 1) {
            *(undefined4 *)
             ((long)endsLiveRange.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage + (ulong)*puVar22 * 4) =
                 local_160._0_4_;
            local_160._0_4_ = local_160._0_4_ + 1;
          }
        }
        pLVar15 = *(pointer *)
                   &(pBVar4->contents).actions.
                    super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>.
                    _M_impl;
        if (*(pointer *)((long)&(pBVar4->contents).actions + 8) != pLVar15) {
          uVar23 = 0;
          do {
            uVar25 = pLVar15[uVar23].index;
            iVar12 = (int)uVar23;
            if (pLVar15[uVar23].what == Get) {
              if (((*(ulong *)((long)&(((Liveness *)local_b8)->start).
                                      super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start + (uVar23 >> 6) * 8)
                    >> (uVar23 & 0x3f) & 1) != 0) &&
                 (bVar10 = SortedVector::erase((SortedVector *)local_68,uVar25), !bVar10)) {
                __assert_fail("erased",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/CoalesceLocals.cpp"
                              ,0xf0,"void wasm::CoalesceLocals::calculateInterferences()");
              }
            }
            else {
              if ((*pLVar15[uVar23].origin)->_id != LocalSetId) {
                __assert_fail("int(_id) == int(T::SpecificId)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                              ,0x314,"T *wasm::Expression::cast() [T = wasm::LocalSet]");
              }
              expr = (Expression *)(*pLVar15[uVar23].origin)[1].type.id;
              if ((expr->_id & 0xfffffffe) == 8) {
                if ((iVar12 == 0) || (expr != *pLVar15[iVar12 - 1U].origin)) {
                  __assert_fail("i > 0 && set->value == *actions[i - 1].origin",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/CoalesceLocals.cpp"
                                ,0xfb,"void wasm::CoalesceLocals::calculateInterferences()");
                }
                IVar13 = *(Index *)((long)endsLiveRange.super__Bvector_base<std::allocator<bool>_>.
                                          _M_impl.super__Bvector_impl_data._M_end_of_storage +
                                   (ulong)pLVar15[iVar12 - 1U].index * 4);
              }
              else {
                IVar13 = ValueNumbering::getValue((ValueNumbering *)local_160,expr);
              }
              puVar8 = live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              *(Index *)((long)endsLiveRange.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_end_of_storage + (ulong)uVar25 * 4) =
                   IVar13;
              if (pLVar15[uVar23].effective == true) {
                for (puVar22 = (uint *)CONCAT71(local_68._1_7_,local_68[0]); puVar22 != puVar8;
                    puVar22 = puVar22 + 1) {
                  uVar2 = *puVar22;
                  if (uVar2 == uVar25) {
                    __assert_fail("other != index",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/CoalesceLocals.cpp"
                                  ,0x110,"void wasm::CoalesceLocals::calculateInterferences()");
                  }
                  if (*(Index *)((long)endsLiveRange.super__Bvector_base<std::allocator<bool>_>.
                                       _M_impl.super__Bvector_impl_data._M_end_of_storage +
                                (ulong)uVar2 * 4) != IVar13) {
                    j_00 = uVar2;
                    i_00 = uVar25;
                    if (uVar2 <= uVar25) {
                      j_00 = uVar25;
                      i_00 = uVar2;
                    }
                    live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage =
                         (pointer)CONCAT71(live.
                                           super_vector<unsigned_int,_std::allocator<unsigned_int>_>
                                           .
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                           1);
                    sparse_square_matrix<bool>::set
                              (&this->interferences,i_00,j_00,
                               (bool *)&live.
                                        super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  }
                }
                SortedVector::insert((SortedVector *)local_68,pLVar15[uVar23].index);
              }
            }
            uVar23 = (ulong)(iVar12 + 1);
            pLVar15 = *(pointer *)
                       &(pBVar4->contents).actions.
                        super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>
                        ._M_impl;
            uVar20 = ((long)*(pointer *)((long)&(pBVar4->contents).actions + 8) - (long)pLVar15 >> 3
                     ) * -0x5555555555555555;
          } while (uVar23 <= uVar20 && uVar20 - uVar23 != 0);
        }
        pvVar9 = (void *)CONCAT71(local_68._1_7_,local_68[0]);
        if (pvVar9 != (void *)0x0) {
          operator_delete(pvVar9,(long)live.
                                       super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar9);
        }
        if (local_b8 != (undefined1  [8])0x0) {
          operator_delete((void *)local_b8,
                          endsLiveRange.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_ -
                          (long)local_b8);
          local_b8 = (undefined1  [8])0x0;
          endsLiveRange.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p._0_4_ = 0;
          endsLiveRange.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_offset = 0;
          endsLiveRange.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._12_4_ = 0;
          endsLiveRange.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p._0_4_ = 0;
          endsLiveRange.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset = 0;
          endsLiveRange.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._12_4_ = 0;
        }
      }
      puVar21 = puVar21 + 1;
    } while (puVar21 != puVar3);
  }
  sVar19 = Function::getNumParams
                     ((this->
                      super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                      ).
                      super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                      .
                      super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
                      .
                      super_ControlFlowWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                      .
                      super_PostWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                      .
                      super_Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                      .currFunction);
  if (sVar19 != 0) {
    uVar23 = 0;
    do {
      IVar13 = (Index)uVar23;
      uVar23 = (ulong)(IVar13 + 1);
      for (uVar20 = uVar23; uVar20 < sVar19; uVar20 = (ulong)((Index)uVar20 + 1)) {
        interfereLowHigh(this,IVar13,(Index)uVar20);
      }
    } while (uVar23 < sVar19);
  }
  pBVar4 = (this->
           super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
           ).super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>.
           super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
           .entry;
  puVar22 = (pBVar4->contents).start.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar7 = (pBVar4->contents).start.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar22 != puVar7) {
    do {
      uVar25 = *puVar22;
      if (sVar19 - 1 < (ulong)uVar25) {
        uVar23 = 0;
        do {
          interfereLowHigh(this,(Index)uVar23,uVar25);
          uVar23 = (ulong)((Index)uVar23 + 1);
        } while (uVar23 < sVar19);
      }
      puVar22 = puVar22 + 1;
    } while (puVar22 != puVar7);
  }
  std::
  _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_unsigned_int>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_unsigned_int>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&valueNumbering.literalValues._M_h._M_single_bucket);
  std::
  _Hashtable<wasm::Literals,_std::pair<const_wasm::Literals,_unsigned_int>,_std::allocator<std::pair<const_wasm::Literals,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Literals>,_std::hash<wasm::Literals>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Literals,_std::pair<const_wasm::Literals,_unsigned_int>,_std::allocator<std::pair<const_wasm::Literals,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Literals>,_std::hash<wasm::Literals>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&valueNumbering);
  if (endsLiveRange.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage != (_Bit_pointer)0x0) {
    operator_delete(endsLiveRange.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage,
                    (long)values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)endsLiveRange.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

void CoalesceLocals::calculateInterferences() {
  interferences.recreate(numLocals);

  // We will track the values in each local, using a numbering where each index
  // represents a unique different value. This array maps a local index to the
  // value index it contains.
  //
  // To avoid reallocating this array all the time, allocate it once outside the
  // loop.
  std::vector<Index> values(numLocals);

  ValueNumbering valueNumbering;

  auto* func = getFunction();

  for (auto& curr : basicBlocks) {
    if (liveBlocks.count(curr.get()) == 0) {
      continue; // ignore dead blocks
    }

    // First, find which gets end a live range. While doing so, also calculate
    // the effectiveness of sets.
    auto& actions = curr->contents.actions;
    std::vector<bool> endsLiveRange(actions.size(), false);
    auto live = curr->contents.end;
    for (int i = int(actions.size()) - 1; i >= 0; i--) {
      auto& action = actions[i];
      auto index = action.index;
      if (action.isGet()) {
        if (!live.has(index)) {
          // The local is not live after us, so its liveness ends here.
          endsLiveRange[i] = true;
          live.insert(index);
        }
      } else {
        // This is a set. Check if the local is alive after it; if it is then
        // the set if effective as there is some get that can read the value.
        if (live.erase(index)) {
          action.effective = true;
        }
      }
    }

    // We have processed from the end of the block to the start, updating |live|
    // as we go, and now it must be equal to the state at the start of the
    // block. We will also use |live| in the next loop, and assume it begins
    // in that state.
    assert(live == curr->contents.start);

    // Now that we know live ranges, check if locals interfere in this block.
    // Locals interfere if they might contain different values on areas where
    // their live ranges overlap. To evaluate that, we do an analysis inside
    // the block that gives each set a unique value number, and as those flow
    // around through copies between sets we can see when sets are guaranteed to
    // be equal.

    if (curr.get() == entry) {
      // Each parameter is assumed to have a different value on entry.
      for (Index i = 0; i < func->getNumParams(); i++) {
        values[i] = valueNumbering.getUniqueValue();
      }

      for (Index i = func->getNumParams(); i < func->getNumLocals(); i++) {
        auto type = func->getLocalType(i);
        if (!LiteralUtils::canMakeZero(type)) {
          // The default value for a type for which we can't make a zero cannot
          // be used anyhow, but we must give it some value in this analysis. A
          // unique one seems least likely to result in surprise during
          // debugging.
          values[i] = valueNumbering.getUniqueValue();
        } else {
          values[i] = valueNumbering.getValue(Literal::makeZeros(type));
        }
      }
    } else {
      // In any block but the entry, assume that each live local might have a
      // different value at the start.
      // TODO: Propagating value IDs across blocks could identify more copies,
      //       however, it would also be nonlinear.
      for (auto index : curr->contents.start) {
        values[index] = valueNumbering.getUniqueValue();
      }
    }

    // Traverse through the block from start to finish. We keep track of both
    // liveness (in |live|) and the value IDs in each local (in |values|)
    // while doing so.
    for (Index i = 0; i < actions.size(); i++) {
      auto& action = actions[i];
      auto index = action.index;
      if (action.isGet()) {
        if (endsLiveRange[i]) {
          [[maybe_unused]] bool erased = live.erase(action.index);
          assert(erased);
        }
        continue;
      }

      // This is a set. Find the value being assigned to the local.
      auto* set = (*action.origin)->cast<LocalSet>();
      Index newValue;
      if (set->value->is<LocalGet>() || set->value->is<LocalSet>()) {
        // This is a copy: Either it is a get or a tee, that occurs right
        // before us. Set our new value to theirs.
        assert(i > 0 && set->value == *actions[i - 1].origin);
        newValue = values[actions[i - 1].index];
      } else {
        // This is not a copy.
        newValue = valueNumbering.getValue(set->value);
      }
      values[index] = newValue;

      // If this set has no gets that read from it, then it does not start a
      // live range, and it cannot cause interference.
      if (!action.effective) {
        continue;
      }

      // Update interferences: This will interfere with any other local that
      // is currently live and contains a different value.
      for (auto other : live) {
        // This index cannot have been live before this set (as we would be
        // trampling some other set before us, if so; and then that set would
        // have been ineffective). We will mark this index as live right after
        // this loop).
        assert(other != index);
        if (values[other] != newValue) {
          interfere(other, index);
        }
      }
      live.insert(action.index);
    }

    // Note that we do not need to do anything for merges: while in general an
    // interference can happen either in a block or when control flow merges,
    // in wasm we have default values for all locals. As a result, if a local is
    // live at the beginning of a block, it will be live at the ends of *all*
    // the blocks reaching it: there is no possibility of an "unset local." That
    // is, imagine we have this merge with a conflict:
    //
    //  [a is set to some value] ->-
    //                              |
    //                              |->- [merge block where a and b are used]
    //                              |
    //  [b is set to some value] ->-
    //
    // It is true that a conflict happens in the merge block, and if we had
    // unset locals then the top block would have b unset, and the bottom block
    // would have a unset, and so there would be no conflict there and the
    // problem would only appear in the merge. But in wasm, that a and b are
    // used in the merge block means that they are live at the end of both the
    // top and bottom block, and that liveness will extend all the way back to
    // *some* set of those values, possibly only the zero-initialization at the
    // function start. Therefore a conflict will be noticed in both the top and
    // bottom blocks, and that merge block does not need to reason about merging
    // its inputs. In other words, a conflict will appear in the middle of a
    // block, somewhere, and therefore we leave it to that block to identify,
    // and so blocks only need to reason about their own contents and not what
    // arrives to them.
    //
    // The one exception here is the entry to the function, see below.
  }

  // We must not try to coalesce parameters as they are fixed. Mark them as
  // "interfering" so that we do not need to special-case them later.
  auto numParams = getFunction()->getNumParams();
  for (Index i = 0; i < numParams; i++) {
    for (Index j = i + 1; j < numParams; j++) {
      interfereLowHigh(i, j);
    }
  }

  // We must handle interference between uses of the zero-init value and
  // parameters manually. A zero initialization represents a set (to a default
  // value), and that set would be what alerts us to a conflict, but there is no
  // actual set in the IR since the zero-init value is applied implicitly.
  for (auto i : entry->contents.start) {
    if (i >= numParams) {
      for (Index j = 0; j < numParams; j++) {
        interfereLowHigh(j, i);
      }
    }
  }
}